

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O2

void Amap_ManCreateChoice(Amap_Man_t *p,Amap_Obj_t *pObj)

{
  Amap_Obj_t *pObj_00;
  uint uVar1;
  uint uVar2;
  
  pObj->field_0x7 = pObj->field_0x7 | 0x40;
  for (pObj_00 = pObj; pObj_00 != (Amap_Obj_t *)0x0; pObj_00 = Amap_ObjChoice(p,pObj_00)) {
    uVar1 = *(uint *)&pObj->field_0x8 & 0xfff;
    uVar2 = *(uint *)&pObj_00->field_0x8 & 0xfff;
    if (uVar2 < uVar1) {
      uVar2 = uVar1;
    }
    *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0xfffff000 | uVar2;
  }
  uVar1 = *(uint *)&pObj->field_0x8 & 0xfff;
  uVar2 = p->nLevelMax;
  if (p->nLevelMax < (int)uVar1) {
    p->nLevelMax = uVar1;
    uVar2 = uVar1;
  }
  if (uVar2 < 0xffe) {
    return;
  }
  __assert_fail("p->nLevelMax < 4094",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapGraph.c"
                ,0xed,"void Amap_ManCreateChoice(Amap_Man_t *, Amap_Obj_t *)");
}

Assistant:

void Amap_ManCreateChoice( Amap_Man_t * p, Amap_Obj_t * pObj )
{
    Amap_Obj_t * pTemp;
    // mark the node as a representative if its class
//    assert( pObj->fRepr == 0 );
    pObj->fRepr = 1;
    // update the level of this node (needed for correct required time computation)
    for ( pTemp = pObj; pTemp; pTemp = Amap_ObjChoice(p, pTemp) )
    {
        pObj->Level = Abc_MaxInt( pObj->Level, pTemp->Level );
//        pTemp->nVisits++; pTemp->nVisitsCopy++;
    }
    // mark the largest level
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    assert( p->nLevelMax < 4094 ); // 2^12-2
}